

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EntryReduce(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  undefined8 pArr_00;
  JavascriptArray *obj_00;
  bool bVar3;
  uint32 length_00;
  undefined4 *puVar4;
  Var pvVar5;
  uint64 length_01;
  int in_stack_00000010;
  undefined1 local_a8 [8];
  AutoTagNativeLibraryEntry __tag;
  ArgumentReader args;
  BigIndex length;
  JsReentLock jsReentLock;
  JavascriptArray *pArr;
  RecyclableObject *obj;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  obj = (RecyclableObject *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)obj) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2727,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b90131;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  __tag.entry.next = (Entry *)obj;
  ArgumentReader::AdjustArguments((ArgumentReader *)&__tag.entry.next,(CallInfo *)&obj);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  length.bigIndex = (uint64)pSVar1->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)length.bigIndex)->noJsReentrancy;
  ((ThreadContext *)length.bigIndex)->noJsReentrancy = true;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_a8,function,(CallInfo)obj,L"Array.prototype.reduce",
             &stack0x00000000);
  bVar3 = ScriptContext::IsJsBuiltInEnabled(pSVar1);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x272e,"(!scriptContext->IsJsBuiltInEnabled())",
                                "!scriptContext->IsJsBuiltInEnabled()");
    if (!bVar3) goto LAB_00b90131;
    *puVar4 = 0;
  }
  if (((ulong)obj & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2733,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00b90131:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (((ulong)__tag.entry.next & 0xffffff) != 0) {
    BigIndex::BigIndex((BigIndex *)&args.super_Arguments.Values,0);
    jsReentLock.m_savedNoJsReentrancy = false;
    jsReentLock._25_7_ = 0;
    pArr = (JavascriptArray *)0x0;
    *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pvVar5 = Arguments::operator[]((Arguments *)&__tag.entry.next,0);
    TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
              (pvVar5,pSVar1,L"Array.prototype.reduce",
               (JavascriptArray **)&jsReentLock.m_savedNoJsReentrancy,(RecyclableObject **)&pArr,
               (BigIndex *)&args.super_Arguments.Values);
    JsReentLock::MutateArrayObject((JsReentLock *)&length.bigIndex);
    obj_00 = pArr;
    pArr_00 = jsReentLock._24_8_;
    *(undefined1 *)(length.bigIndex + 0x108) = 1;
    *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if ((int)args.super_Arguments.Values == -1) {
      length_01 = BigIndex::GetBigIndex((BigIndex *)&args.super_Arguments.Values);
      pvVar5 = ReduceHelper<unsigned_long>
                         ((JavascriptArray *)pArr_00,(TypedArrayBase *)0x0,
                          (RecyclableObject *)obj_00,length_01,(Arguments *)&__tag.entry.next,pSVar1
                         );
    }
    else {
      length_00 = BigIndex::GetSmallIndex((BigIndex *)&args.super_Arguments.Values);
      pvVar5 = ReduceHelper<unsigned_int>
                         ((JavascriptArray *)pArr_00,(TypedArrayBase *)0x0,
                          (RecyclableObject *)obj_00,length_00,(Arguments *)&__tag.entry.next,pSVar1
                         );
    }
    AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_a8);
    *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    return pvVar5;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Array.prototype.reduce");
}

Assistant:

Var JavascriptArray::EntryReduce(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Array.prototype.reduce"));

#ifdef ENABLE_JS_BUILTINS
        Assert(!scriptContext->IsJsBuiltInEnabled());
#endif

        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Array_Prototype_reduce);

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.reduce"));
        }

        BigIndex length;
        JavascriptArray * pArr = nullptr;
        RecyclableObject* obj = nullptr;
        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.reduce"), &pArr, &obj, &length));

        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceHelper(pArr, nullptr, obj, length.GetSmallIndex(), args, scriptContext));
        }

        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceHelper(pArr, nullptr, obj, length.GetBigIndex(), args, scriptContext));
    }